

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::WriteNode(cmGraphVizWriter *this,cmGeneratedFileStream *fs,cmLinkItem *item)

{
  string *__return_storage_ptr__;
  string *__k;
  mapped_type *pmVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 local_70 [8];
  string escapedLabel;
  string itemNameWithAliases;
  mapped_type *nodeName;
  string *itemName;
  cmLinkItem *item_local;
  cmGeneratedFileStream *fs_local;
  cmGraphVizWriter *this_local;
  
  __k = cmLinkItem::AsStr_abi_cxx11_(item);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k);
  __return_storage_ptr__ = (string *)((long)&escapedLabel.field_2 + 8);
  ItemNameWithAliases(__return_storage_ptr__,this,__k);
  EscapeForDotFile((string *)local_70,__return_storage_ptr__);
  poVar2 = std::operator<<((ostream *)fs,"    \"");
  poVar2 = std::operator<<(poVar2,(string *)pmVar1);
  poVar2 = std::operator<<(poVar2,"\" [ label = \"");
  poVar2 = std::operator<<(poVar2,(string *)local_70);
  poVar2 = std::operator<<(poVar2,"\", shape = ");
  pcVar3 = anon_unknown.dwarf_12efbbe::getShapeForTarget(item);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2," ];\n");
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(escapedLabel.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGraphVizWriter::WriteNode(cmGeneratedFileStream& fs,
                                 cmLinkItem const& item)
{
  auto const& itemName = item.AsStr();
  auto const& nodeName = this->NodeNames[itemName];

  auto const itemNameWithAliases = this->ItemNameWithAliases(itemName);
  auto const escapedLabel = EscapeForDotFile(itemNameWithAliases);

  fs << "    \"" << nodeName << "\" [ label = \"" << escapedLabel
     << "\", shape = " << getShapeForTarget(item) << " ];\n";
}